

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

bool __thiscall
GameBoard::checkDirectDropTo(GameBoard *this,int color,int blockType,int x,int y,int o)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  bVar2 = true;
  if (x < 0x15) {
    bVar2 = false;
    do {
      lVar3 = 0;
      do {
        uVar4 = blockShape[blockType][o][lVar3 * 2] + x;
        if ((int)uVar4 < 0x15) {
          if ((int)uVar4 < 1) {
            return bVar2;
          }
          uVar5 = *(int *)((long)o * 0x20 + (long)blockType * 0x80 + 0x11dd94 + lVar3 * 8) + y;
          if (uVar5 - 0xb < 0xfffffff6) {
            return bVar2;
          }
          if (this->gridInfo[color][uVar4][uVar5] != 0) {
            return bVar2;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      iVar1 = x + 1;
      bVar2 = 0x13 < x;
      x = iVar1;
    } while (iVar1 != 0x15);
  }
  return bVar2;
}

Assistant:

bool GameBoard::checkDirectDropTo(int color, int blockType, int x, int y, int o)
{
    auto &def = blockShape[blockType][o];
    for (; x <= MAPHEIGHT; x++)
        for (int i = 0; i < 4; i++) {
            int _x = def[i * 2] + x, _y = def[i * 2 + 1] + y;
            if (_x > MAPHEIGHT)
                continue;
            if (_x < 1 || _y < 1 || _y > MAPWIDTH || gridInfo[color][_x][_y])
                return false;
        }
    return true;
}